

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8
StringBuilder<unsigned_long,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&>
          (unsigned_long *arg,char (*args) [2],char *args_1,char (*args_2) [2],unsigned_long *args_3
          ,char (*args_4) [2],char *args_5,char (*args_6) [2],unsigned_long *args_7,
          char (*args_8) [2],char *args_9)

{
  char (*in_RCX) [2];
  char *unaff_RBX;
  undefined8 in_RDI;
  char *in_R8;
  char (*in_R9) [2];
  char (*unaff_R14) [2];
  unsigned_long *unaff_retaddr;
  char (*in_stack_00000008) [2];
  char *in_stack_00000010;
  unsigned_long *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string local_80 [32];
  string local_60 [16];
  char (*in_stack_ffffffffffffffb0) [2];
  unsigned_long *in_stack_ffffffffffffffb8;
  
  StringBuilder<unsigned_long>(in_stack_ffffffffffffff38);
  StringBuilder<char[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,unaff_RBX,
             unaff_R14,unaff_retaddr,in_stack_00000008,in_stack_00000010);
  std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}